

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

uint8_t * VP8LBitWriterFinish(VP8LBitWriter *bw)

{
  undefined1 *puVar1;
  int iVar2;
  ulong *in_RDI;
  size_t in_stack_00000020;
  VP8LBitWriter *in_stack_00000028;
  
  iVar2 = VP8LBitWriterResize(in_stack_00000028,in_stack_00000020);
  if (iVar2 != 0) {
    while (0 < (int)in_RDI[1]) {
      puVar1 = (undefined1 *)in_RDI[3];
      in_RDI[3] = (ulong)(puVar1 + 1);
      *puVar1 = (char)*in_RDI;
      *in_RDI = *in_RDI >> 8;
      *(int *)(in_RDI + 1) = (int)in_RDI[1] + -8;
    }
    *(undefined4 *)(in_RDI + 1) = 0;
  }
  return (uint8_t *)in_RDI[2];
}

Assistant:

uint8_t* VP8LBitWriterFinish(VP8LBitWriter* const bw) {
  // flush leftover bits
  if (VP8LBitWriterResize(bw, (bw->used_ + 7) >> 3)) {
    while (bw->used_ > 0) {
      *bw->cur_++ = (uint8_t)bw->bits_;
      bw->bits_ >>= 8;
      bw->used_ -= 8;
    }
    bw->used_ = 0;
  }
  return bw->buf_;
}